

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::wsi::anon_unknown_0::DisplayTimingTestInstance::iterate
          (TestStatus *__return_storage_ptr__,DisplayTimingTestInstance *this)

{
  qpTestResult code;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  string local_5c0 [32];
  Error *error;
  MessageBuilder local_198;
  DisplayTimingTestInstance *local_18;
  DisplayTimingTestInstance *this_local;
  
  local_18 = this;
  this_local = (DisplayTimingTestInstance *)__return_storage_ptr__;
  if (this->m_frameNdx == 0) {
    if (this->m_outOfDateCount == 0) {
      this_00 = Context::getTestContext((this->super_TestInstance).m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [12])"Swapchain: ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_swapchainConfig);
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_198);
    }
    initSwapchainResources(this);
  }
  render(this);
  this->m_frameNdx = this->m_frameNdx + 1;
  if (this->m_frameNdx < this->m_frameCount) {
    tcu::TestStatus::incomplete();
  }
  else {
    deinitSwapchainResources(this);
    code = tcu::ResultCollector::getResult(&this->m_resultCollector);
    tcu::ResultCollector::getMessage_abi_cxx11_(local_5c0,&this->m_resultCollector);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,code,local_5c0);
    std::__cxx11::string::~string((string *)local_5c0);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DisplayTimingTestInstance::iterate (void)
{
	// Initialize swapchain specific resources
	// Render test
	try
	{
		if (m_frameNdx == 0)
		{
			if (m_outOfDateCount == 0)
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Swapchain: " << m_swapchainConfig << tcu::TestLog::EndMessage;

			initSwapchainResources();
		}

		render();
	}
	catch (const vk::Error& error)
	{
		if (error.getError() == vk::VK_ERROR_OUT_OF_DATE_KHR)
		{
			if (m_outOfDateCount < m_maxOutOfDateCount)
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Frame " << m_frameNdx << ": Swapchain out of date. Recreating resources." << TestLog::EndMessage;
				deinitSwapchainResources();
				m_frameNdx = 0;
				m_outOfDateCount++;

				return tcu::TestStatus::incomplete();
			}
			else
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Frame " << m_frameNdx << ": Swapchain out of date." << TestLog::EndMessage;
				m_resultCollector.fail("Received too many VK_ERROR_OUT_OF_DATE_KHR errors. Received " + de::toString(m_outOfDateCount) + ", max " + de::toString(m_maxOutOfDateCount));
			}
		}
		else
		{
			m_resultCollector.fail(error.what());
		}

		deinitSwapchainResources();

		return tcu::TestStatus(m_resultCollector.getResult(), m_resultCollector.getMessage());
	}

	m_frameNdx++;

	if (m_frameNdx >= m_frameCount)
	{
		deinitSwapchainResources();

		return tcu::TestStatus(m_resultCollector.getResult(), m_resultCollector.getMessage());
	}
	else
		return tcu::TestStatus::incomplete();
}